

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_passColName(void *highs,HighsInt col,char *name)

{
  HighsStatus HVar1;
  char *in_RDX;
  string *in_stack_ffffffffffffffb8;
  HighsInt in_stack_ffffffffffffffc4;
  Highs *in_stack_ffffffffffffffc8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffc8,in_RDX,(allocator *)&stack0xffffffffffffffc7);
  HVar1 = Highs::passColName(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                             in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  return HVar1;
}

Assistant:

HighsInt Highs_passColName(const void* highs, const HighsInt col,
                           const char* name) {
  return (HighsInt)((Highs*)highs)->passColName(col, std::string(name));
}